

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::switchToFullscreen(WindowImplX11 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Display *pDVar2;
  bool bVar3;
  int iVar4;
  Atom AVar5;
  Atom AVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  string local_e0;
  Window local_c0;
  Atom local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  Atom local_a0;
  undefined8 local_90;
  
  grabFocus(this);
  bVar3 = anon_unknown.dwarf_3f5874::WindowsImplX11Impl::ewmhSupported();
  if (bVar3) {
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"_NET_WM_BYPASS_COMPOSITOR","");
    AVar5 = getAtom(&local_e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (AVar5 != 0) {
      XChangeProperty(this->m_display,this->m_window,AVar5,6,0x20,0,
                      &switchToFullscreen::bypassCompositor,1);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"_NET_WM_STATE","");
    AVar5 = getAtom(&local_e0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"_NET_WM_STATE_FULLSCREEN","");
    AVar6 = getAtom(&local_e0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (AVar5 == 0 || AVar6 == 0) {
      poVar7 = err();
      pcVar9 = "Setting fullscreen failed. Could not get required atoms";
      lVar8 = 0x37;
    }
    else {
      memset(&local_e0,0,0xc0);
      local_e0._M_dataplus._M_p._0_4_ = 0x21;
      local_c0 = this->m_window;
      local_b0 = 0x20;
      local_a8 = 1;
      local_90 = 1;
      pDVar2 = this->m_display;
      local_b8 = AVar5;
      local_a0 = AVar6;
      iVar4 = XSendEvent(pDVar2,*(undefined8 *)
                                 (*(long *)(pDVar2 + 0xe8) + 0x10 +
                                 (long)*(int *)(pDVar2 + 0xe0) * 0x80),0,0x180000,&local_e0);
      if (iVar4 != 0) {
        return;
      }
      poVar7 = err();
      pcVar9 = "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event";
      lVar8 = 0x3f;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  return;
}

Assistant:

void WindowImplX11::switchToFullscreen()
{
    using namespace WindowsImplX11Impl;

    grabFocus();

    if (ewmhSupported())
    {
        Atom netWmBypassCompositor = getAtom("_NET_WM_BYPASS_COMPOSITOR");

        if (netWmBypassCompositor)
        {
            static const unsigned long bypassCompositor = 1;

            XChangeProperty(m_display,
                            m_window,
                            netWmBypassCompositor,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&bypassCompositor),
                            1);
        }

        Atom netWmState = getAtom("_NET_WM_STATE", true);
        Atom netWmStateFullscreen = getAtom("_NET_WM_STATE_FULLSCREEN", true);

        if (!netWmState || !netWmStateFullscreen)
        {
            err() << "Setting fullscreen failed. Could not get required atoms" << std::endl;
            return;
        }

        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netWmState;
        event.xclient.data.l[0] = 1; // _NET_WM_STATE_ADD
        event.xclient.data.l[1] = static_cast<long>(netWmStateFullscreen);
        event.xclient.data.l[2] = 0; // No second property
        event.xclient.data.l[3] = 1; // Normal window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event" << std::endl;
    }
}